

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O0

node_t_conflict
find_def(c2m_ctx_t c2m_ctx,symbol_mode mode,node_t_conflict id,node_t_conflict scope,
        node_t_conflict *aux_node)

{
  int iVar1;
  undefined1 local_68 [8];
  symbol_t sym;
  node_t_conflict *aux_node_local;
  node_t_conflict scope_local;
  node_t_conflict id_local;
  symbol_mode mode_local;
  c2m_ctx_t c2m_ctx_local;
  
  sym.defs = (VARR_node_t *)aux_node;
  aux_node_local = (node_t_conflict *)scope;
  while( true ) {
    iVar1 = symbol_find(c2m_ctx,mode,id,(node_t_conflict)aux_node_local,(symbol_t *)local_68);
    if (iVar1 != 0) {
      if (sym.defs != (VARR_node_t *)0x0) {
        (sym.defs)->els_num = (size_t)sym.def_node;
      }
      return sym.scope;
    }
    if (aux_node_local == (node_t_conflict *)0x0) break;
    aux_node_local = (node_t_conflict *)(aux_node_local[1]->u).s.s;
  }
  return (node_t_conflict)0x0;
}

Assistant:

static node_t find_def (c2m_ctx_t c2m_ctx, enum symbol_mode mode, node_t id, node_t scope,
                        node_t *aux_node) {
  symbol_t sym;

  for (;;) {
    if (!symbol_find (c2m_ctx, mode, id, scope, &sym)) {
      if (scope == NULL) return NULL;
      scope = ((struct node_scope *) scope->attr)->scope;
    } else {
      if (aux_node) *aux_node = sym.aux_node;
      return sym.def_node;
    }
  }
}